

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
* __thiscall
enact::Parser::parse
          (vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_f8 [8];
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> stmt;
  string local_e0;
  Lexer local_c0;
  Parser *local_18;
  Parser *this_local;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  *ast;
  
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  psVar2 = CompileContext::getSource_abi_cxx11_(this->m_context);
  std::__cxx11::string::string((string *)&local_e0,(string *)psVar2);
  Lexer::Lexer(&local_c0,&local_e0);
  Lexer::operator=(&this->m_scanner,&local_c0);
  Lexer::~Lexer(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  advance(this);
  stmt._M_t.super___uniq_ptr_impl<enact::Stmt,_std::default_delete<enact::Stmt>_>._M_t.
  super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>.
  super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl._3_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::vector(__return_storage_ptr__);
  while (bVar1 = isAtEnd(this), ((bVar1 ^ 0xffU) & 1) != 0) {
    parseStmt((Parser *)local_f8);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_f8);
    if (bVar1) {
      std::
      vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_f8);
    }
    std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::~unique_ptr
              ((unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Stmt>> Parser::parse() {
        m_scanner = Lexer{m_context.getSource()};
        advance();

        std::vector<std::unique_ptr<Stmt>> ast{};
        while (!isAtEnd()) {
            std::unique_ptr<Stmt> stmt = parseStmt();
            if (stmt) ast.push_back(std::move(stmt));
        }

        return ast;
    }